

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation.cpp
# Opt level: O3

bool QNetworkInformation::loadBackendByName(QStringView backend)

{
  char cVar1;
  int iVar2;
  QNetworkInformation *pQVar3;
  storage_type_conflict *in_RDX;
  long in_FS_OFFSET;
  bool bVar4;
  QStringView QVar5;
  QStringView name;
  QStringView QVar6;
  QStringView QVar7;
  QArrayData *local_38;
  storage_type_conflict *local_30;
  qsizetype local_28;
  long local_20;
  storage_type_conflict *extraout_RDX;
  
  QVar5.m_data = backend.m_data;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QNetworkInformationPrivate *)backend.m_size == (QNetworkInformationPrivate *)0x5) {
    QVar5.m_size = 5;
    QVar6.m_data = L"dummy";
    QVar6.m_size = 5;
    cVar1 = QtPrivate::equalStrings(QVar5,QVar6);
    in_RDX = extraout_RDX;
    if (cVar1 != '\0') {
      pQVar3 = QNetworkInformationPrivate::createDummy();
      bVar4 = pQVar3 != (QNetworkInformation *)0x0;
      goto LAB_001b576c;
    }
  }
  name.m_data = in_RDX;
  name.m_size = (qsizetype)QVar5.m_data;
  pQVar3 = QNetworkInformationPrivate::create((QNetworkInformationPrivate *)backend.m_size,name);
  if (pQVar3 == (QNetworkInformation *)0x0) {
    bVar4 = false;
  }
  else {
    (**(code **)(**(long **)(*(long *)&pQVar3->field_0x8 + 0x78) + 0x60))(&local_38);
    QVar7.m_data = local_30;
    QVar7.m_size = local_28;
    iVar2 = QtPrivate::compareStrings(backend,QVar7,CaseInsensitive);
    bVar4 = iVar2 == 0;
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38,2,0x10);
      }
    }
  }
LAB_001b576c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QNetworkInformation::loadBackendByName(QStringView backend)
{
    if (backend == u"dummy")
        return QNetworkInformationPrivate::createDummy() != nullptr;

    auto loadedBackend = QNetworkInformationPrivate::create(backend);
    return loadedBackend && loadedBackend->backendName().compare(backend, Qt::CaseInsensitive) == 0;
}